

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeTestsUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)13>_> *
vkt::compute::makeImageView
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice vkDevice,VkImage image,VkImageViewType imageViewType,VkFormat format,
          VkImageSubresourceRange subresourceRange)

{
  VkImageSubresourceRange VVar1;
  undefined1 local_80 [8];
  VkImageViewCreateInfo imageViewParams;
  VkFormat format_local;
  VkImageViewType imageViewType_local;
  VkDevice vkDevice_local;
  DeviceInterface *vk_local;
  VkImage image_local;
  
  VVar1 = subresourceRange;
  local_80._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  imageViewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageViewParams._4_4_ = 0;
  imageViewParams.pNext._0_4_ = 0;
  imageViewParams._16_8_ = image.m_internal;
  imageViewParams.image.m_internal._0_4_ = imageViewType;
  imageViewParams.image.m_internal._4_4_ = format;
  imageViewParams.subresourceRange.layerCount = format;
  imageViewParams._76_4_ = imageViewType;
  imageViewParams._32_16_ = ::vk::makeComponentMappingRGBA();
  imageViewParams.components.b = subresourceRange.aspectMask;
  imageViewParams.components.a = subresourceRange.baseMipLevel;
  subresourceRange._8_8_ = VVar1._8_8_;
  imageViewParams.subresourceRange.aspectMask = subresourceRange.levelCount;
  imageViewParams.subresourceRange.baseMipLevel = subresourceRange.baseArrayLayer;
  subresourceRange.layerCount = VVar1.layerCount;
  imageViewParams.subresourceRange.levelCount = subresourceRange.layerCount;
  ::vk::createImageView
            (__return_storage_ptr__,vk,vkDevice,(VkImageViewCreateInfo *)local_80,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImageView> makeImageView (const DeviceInterface&			vk,
								 const VkDevice					vkDevice,
								 const VkImage					image,
								 const VkImageViewType			imageViewType,
								 const VkFormat					format,
								 const VkImageSubresourceRange	subresourceRange)
{
	const VkImageViewCreateInfo imageViewParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,		// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkImageViewCreateFlags	flags;
		image,											// VkImage					image;
		imageViewType,									// VkImageViewType			viewType;
		format,											// VkFormat					format;
		makeComponentMappingRGBA(),						// VkComponentMapping		components;
		subresourceRange,								// VkImageSubresourceRange	subresourceRange;
	};
	return createImageView(vk, vkDevice, &imageViewParams);
}